

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_set.cpp
# Opt level: O0

bool __thiscall miniros::PollSet::addEvents(PollSet *this,int sock,int events)

{
  bool bVar1;
  iterator this_00;
  pointer ppVar2;
  uint in_EDX;
  __sighandler_t __handler;
  int in_ESI;
  int fd;
  PollSet *in_RDI;
  bool enabled;
  iterator it;
  scoped_lock<std::mutex> lock;
  map<int,_miniros::PollSet::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
  *in_stack_ffffffffffffff48;
  Level level;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  Level in_stack_ffffffffffffff74;
  int epfd;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  LogLocation *loc;
  LogLocation local_61 [2];
  _Self local_40 [3];
  _Self local_28 [2];
  uint local_18;
  int local_14;
  byte local_1;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (mutex_type *)in_stack_ffffffffffffff48);
  this_00 = std::
            map<int,_miniros::PollSet::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
            ::find(in_stack_ffffffffffffff48,(key_type_conflict1 *)0x48477d);
  local_28[0]._M_node = this_00._M_node;
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_miniros::PollSet::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
       ::end(in_stack_ffffffffffffff48);
  level = (Level)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  bVar1 = std::operator==(local_28,local_40);
  if (bVar1) {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((addEvents::loc.initialized_ ^ 0xffU) & 1) != 0) {
      loc = local_61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 this_00._M_node,(char *)in_RDI,(allocator<char> *)loc);
      console::initializeLogLocation
                (loc,(string *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 in_stack_ffffffffffffff74);
      std::__cxx11::string::~string((string *)&local_61[0].logger_enabled_);
      std::allocator<char>::~allocator((allocator<char> *)local_61);
    }
    if (addEvents::loc.level_ != Debug) {
      console::setLogLocationLevel
                ((LogLocation *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),level)
      ;
      console::checkLogLocationEnabled
                ((LogLocation *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    }
    if ((addEvents::loc.logger_enabled_ & 1U) != 0) {
      console::print((FilterBase *)0x0,addEvents::loc.logger_,(Level)(ulong)addEvents::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/poll_set.cpp"
                     ,0x88,"bool miniros::PollSet::addEvents(int, int)",
                     "PollSet: Tried to add events [%d] to fd [%d] which does not exist in this pollset"
                     ,local_18,local_14);
    }
    local_1 = 0;
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_miniros::PollSet::SocketInfo>_> *)
                        0x484972);
    (ppVar2->second).events_ = (ppVar2->second).events_ | local_18;
    epfd = in_RDI->epfd_;
    fd = local_14;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_miniros::PollSet::SocketInfo>_> *)
                        0x4849a5);
    set_events_on_socket(epfd,fd,(ppVar2->second).events_);
    in_RDI->sockets_changed_ = true;
    signal(in_RDI,fd,__handler);
    local_1 = 1;
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4849e4);
  return (bool)(local_1 & 1);
}

Assistant:

bool PollSet::addEvents(int sock, int events)
{
  std::scoped_lock<std::mutex> lock(socket_info_mutex_);

  M_SocketInfo::iterator it = socket_info_.find(sock);

  if (it == socket_info_.end())
  {
    MINIROS_DEBUG("PollSet: Tried to add events [%d] to fd [%d] which does not exist in this pollset", events, sock);
    return false;
  }

  it->second.events_ |= events;

  set_events_on_socket(epfd_, sock, it->second.events_);

  sockets_changed_ = true;
  signal();

  return true;
}